

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

uint qNumVariantToHelper<unsigned_int>(Private *d,bool *ok)

{
  long lVar1;
  bool bVar2;
  QMetaType from;
  uint *puVar3;
  QMetaType this;
  undefined1 *in_RSI;
  long in_FS_OFFSET;
  bool success;
  uint ret;
  QMetaType t;
  QMetaType in_stack_00000070;
  QMetaType in_stack_00000078;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Private *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  from = QMetaType::fromType<unsigned_int>();
  if (in_RSI != (undefined1 *)0x0) {
    *in_RSI = 1;
  }
  QVariant::Private::type(in_stack_ffffffffffffffb0);
  bVar2 = operator==((QMetaType *)in_stack_ffffffffffffffb0,
                     (QMetaType *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (bVar2) {
    puVar3 = QVariant::Private::get<unsigned_int>((Private *)0x43ebf4);
    uVar4 = *puVar3;
  }
  else {
    this = QVariant::Private::type(in_stack_ffffffffffffffb0);
    QVariant::Private::storage((Private *)this.d_ptr);
    bVar2 = QMetaType::convert(in_stack_00000078,from.d_ptr,in_stack_00000070,
                               (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                              );
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = bVar2;
    }
    uVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

inline T qNumVariantToHelper(const QVariant::Private &d, bool *ok)
{
    QMetaType t = QMetaType::fromType<T>();
    if (ok)
        *ok = true;

    if (d.type() == t)
        return d.get<T>();

    T ret = 0;
    bool success = QMetaType::convert(d.type(), d.storage(), t, &ret);
    if (ok)
        *ok = success;
    return ret;
}